

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O2

Slice leveldb::test::RandomString(Random *rnd,int len,string *dst)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  Slice SVar4;
  
  std::__cxx11::string::resize((ulong)dst);
  uVar2 = 0;
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = Random::Next(rnd);
    (dst->_M_dataplus)._M_p[uVar2] = (char)((ulong)uVar1 % 0x5f) + ' ';
  }
  SVar4.data_ = (dst->_M_dataplus)._M_p;
  SVar4.size_ = dst->_M_string_length;
  return SVar4;
}

Assistant:

Slice RandomString(Random* rnd, int len, std::string* dst) {
  dst->resize(len);
  for (int i = 0; i < len; i++) {
    (*dst)[i] = static_cast<char>(' ' + rnd->Uniform(95));  // ' ' .. '~'
  }
  return Slice(*dst);
}